

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

void __thiscall Node::OutputGetPutOptions(Node *this,Node *Channel,ostream *os)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  string local_90;
  string local_70;
  string local_50;
  
  while (iVar4 = this->Type, iVar4 == 0x1f5) {
    if (this->Tree[0] != (Node *)0x0) {
      OutputGetPutOptions(this->Tree[0],Channel,os);
    }
    this = this->Tree[1];
    if (this == (Node *)0x0) {
      return;
    }
  }
  if (iVar4 < 0x183) {
    if (iVar4 == 0x10b) {
LAB_0011ab40:
      iVar4 = 0;
      if (0 < Level) {
        iVar4 = Level;
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_70,(char)iVar4);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_70._M_dataplus._M_p,local_70._M_string_length);
      GetIPChannel_abi_cxx11_(&local_90,Channel,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetRecord(",0xb);
      Expression_abi_cxx11_(&local_50,this->Tree[0]);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return;
      }
      goto LAB_0011ae58;
    }
    if (iVar4 == 0x121) {
      GetIPChannel_abi_cxx11_(&local_70,Channel,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetCount(",10);
      Expression_abi_cxx11_(&local_90,this->Tree[0]);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      goto LAB_0011ae2f;
    }
    if (iVar4 != 0x159) goto LAB_0011ad98;
    iVar4 = 0;
    if (0 < Level) {
      iVar4 = Level;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)iVar4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_70._M_dataplus._M_p,local_70._M_string_length);
    GetIPChannel_abi_cxx11_(&local_90,Channel,0);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetKey(",8);
    Expression_abi_cxx11_(&local_50,this->Tree[0]);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_90.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (this->Tree[1] == (Node *)0x0) {
      return;
    }
    iVar4 = 0;
    if (0 < Level) {
      iVar4 = Level;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)iVar4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_70._M_dataplus._M_p,local_70._M_string_length);
    GetIPChannel_abi_cxx11_(&local_90,Channel,0);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetKeyMode(",0xc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    iVar4 = this->Tree[1]->Type;
    if (iVar4 == 0x130) {
      pcVar5 = "Equal";
      lVar3 = 5;
LAB_0011ae8e:
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,lVar3);
    }
    else {
      if (iVar4 == 0x147) {
        pcVar5 = "GreaterEqual";
        lVar3 = 0xc;
        goto LAB_0011ae8e;
      }
      if (iVar4 == 0x14d) {
        pcVar5 = "Greater";
        lVar3 = 7;
        goto LAB_0011ae8e;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,");",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
    std::ostream::put((char)os);
    poVar2 = (ostream *)std::ostream::flush();
    iVar4 = 0;
    if (0 < Level) {
      iVar4 = Level;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)iVar4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
    GetIPChannel_abi_cxx11_(&local_90,Channel,0);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetKeyValue(",0xd);
    Expression_abi_cxx11_(&local_50,this->Tree[2]);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (iVar4 < 0x191) {
      if (iVar4 == 0x183) goto LAB_0011ab40;
      if (iVar4 == 0x187) {
        iVar4 = 0;
        if (0 < Level) {
          iVar4 = Level;
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_70,(char)iVar4);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_70._M_dataplus._M_p,local_70._M_string_length);
        GetIPChannel_abi_cxx11_(&local_90,Channel,0);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetRegardless();",0x11);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) {
          return;
        }
        goto LAB_0011ae58;
      }
LAB_0011ad98:
      GetIPChannel_abi_cxx11_(&local_70,Channel,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".Goofy(",7);
      Expression_abi_cxx11_(&local_90,this);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    else {
      if (iVar4 != 0x191) {
        if (iVar4 == 0x1d5) goto LAB_0011ab40;
        goto LAB_0011ad98;
      }
      GetIPChannel_abi_cxx11_(&local_70,Channel,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".SetRfaValue(",0xd);
      Expression_abi_cxx11_(&local_90,this->Tree[0]);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
LAB_0011ae2f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return;
  }
LAB_0011ae58:
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void Node::OutputGetPutOptions(
	Node* Channel,		/**< BASIC channel */
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	switch(Type)
	{
	case BAS_N_LIST:
		if (Tree[0] != 0)
		{
			Tree[0]->OutputGetPutOptions(Channel, os);
		}
		if (Tree[1] != 0)
		{
			Tree[1]->OutputGetPutOptions(Channel, os);
		}
		break;

	case BAS_V_RMSRECORD:
	case BAS_S_RECORD:
	case BAS_S_BLOCK:
		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetRecord(" <<
			Tree[0]->Expression() << ");" << std::endl;
		break;

	case BAS_S_REGARDLESS:
		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetRegardless();" << std::endl;
		break;

	case BAS_S_KEY:
		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetKey(" << Tree[0]->Expression() << ");" <<
			std::endl;
		if (Tree[1] != 0)
		{
			os << Indent() <<
				GetIPChannel(Channel, 0) <<
				".SetKeyMode(";
			switch(Tree[1]->Type)
			{
			case BAS_S_EQ:
				os << "Equal";
				break;
			case BAS_S_GE:
				os << "GreaterEqual";
				break;
			case BAS_S_GT:
				os << "Greater";
				break;

			}
			os << ");" << std::endl <<
				Indent() <<
				GetIPChannel(Channel, 0) <<
				".SetKeyValue(" << Tree[2]->Expression() << ");" << std::endl;
		}
		break;

	case BAS_S_RFA:
		os <<
			GetIPChannel(Channel, 0) <<
			".SetRfaValue(" <<
			Tree[0]->Expression() << ");" << std::endl;
		break;

	case BAS_S_COUNT:
		os <<
			GetIPChannel(Channel, 0) <<
			".SetCount(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;
	default:
		os <<
			GetIPChannel(Channel, 0) <<
			".Goofy(" << Expression() << ");" << std::endl;
	}
}